

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS ref_clump_tri_around(REF_GRID_conflict ref_grid,REF_INT node,char *filename)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  FILE *__s;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT RVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  REF_INT local;
  REF_DICT node_dict;
  REF_DICT tri_dict;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_INT nodes [27];
  REF_DBL m [6];
  REF_DBL jacob [9];
  int local_184;
  REF_DICT local_180;
  REF_DICT local_178;
  REF_GRID_conflict local_170;
  ulong local_168;
  char *local_160;
  double local_158;
  double local_150;
  double local_148;
  REF_DBL local_138;
  undefined8 local_130;
  undefined8 local_128;
  REF_INT local_118 [28];
  REF_DBL local_a8 [6];
  REF_DBL local_78 [9];
  
  ref_cell = ref_grid->cell[3];
  uVar4 = ref_dict_create(&local_180);
  if (uVar4 == 0) {
    local_160 = filename;
    uVar4 = ref_dict_create(&local_178);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x181
             ,"ref_clump_tri_around",(ulong)uVar4,"create tris");
      return uVar4;
    }
    uVar9 = 0xffffffff;
    if (-1 < node) {
      uVar9 = 0xffffffff;
      if (node < ref_cell->ref_adj->nnode) {
        uVar9 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
      }
    }
    local_170 = ref_grid;
    local_168 = (ulong)(uint)node;
    if ((int)uVar9 != -1) {
      RVar8 = ref_cell->ref_adj->item[(int)uVar9].ref;
      do {
        uVar4 = ref_cell_nodes(ref_cell,RVar8,local_118);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x184,"ref_clump_tri_around",(ulong)uVar4,"n");
          return uVar4;
        }
        uVar4 = ref_dict_store(local_178,RVar8,0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x185,"ref_clump_tri_around",(ulong)uVar4,"store");
          return uVar4;
        }
        if (0 < ref_cell->node_per) {
          lVar11 = 0;
          do {
            uVar4 = ref_dict_store(local_180,local_118[lVar11],0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x187,"ref_clump_tri_around",(ulong)uVar4,"store");
              return uVar4;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < ref_cell->node_per);
        }
        pRVar2 = ref_cell->ref_adj->item;
        iVar1 = pRVar2[(int)uVar9].next;
        uVar9 = (ulong)iVar1;
        if (uVar9 == 0xffffffffffffffff) {
          RVar8 = -1;
        }
        else {
          RVar8 = pRVar2[uVar9].ref;
        }
      } while (iVar1 != -1);
    }
    pcVar7 = local_160;
    __s = fopen(local_160,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",pcVar7);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x18c
             ,"ref_clump_tri_around","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    fprintf(__s,"zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)local_180->n,(ulong)(uint)local_178->n,"point","fequadrilateral");
    RVar8 = (REF_INT)local_168;
    uVar4 = ref_node_metric_get(local_170->node,RVar8,local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x196
             ,"ref_clump_tri_around",(ulong)uVar4,"get");
      return uVar4;
    }
    uVar4 = ref_matrix_jacob_m(local_a8,local_78);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x197
             ,"ref_clump_tri_around",(ulong)uVar4,"jac");
      return uVar4;
    }
    if (0 < local_180->n) {
      lVar11 = (long)(RVar8 * 0xf);
      lVar10 = 0;
      do {
        local_184 = local_180->key[lVar10];
        lVar5 = (long)local_184;
        pRVar3 = local_170->node->real;
        local_158 = pRVar3[lVar5 * 0xf] - pRVar3[lVar11];
        local_150 = pRVar3[lVar5 * 0xf + 1] - pRVar3[lVar11 + 1];
        local_148 = pRVar3[lVar5 * 0xf + 2] - pRVar3[lVar11 + 2];
        uVar4 = ref_matrix_vect_mult(local_78,&local_158,&local_138);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x1a0,"ref_clump_tri_around",(ulong)uVar4,"ax");
          return uVar4;
        }
        fprintf(__s," %.16e %.16e %.16e\n",local_138,local_130,local_128);
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_180->n);
    }
    if (0 < local_178->n) {
      lVar11 = 0;
      do {
        uVar4 = ref_cell_nodes(ref_cell,local_178->key[lVar11],local_118);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x1a6,"ref_clump_tri_around",(ulong)uVar4,"n");
          return uVar4;
        }
        if (0 < ref_cell->node_per) {
          lVar10 = 0;
          do {
            uVar4 = ref_dict_location(local_180,local_118[lVar10],&local_184);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x1a8,"ref_clump_tri_around",(ulong)uVar4,"ret");
              return uVar4;
            }
            fprintf(__s," %d",(ulong)(local_184 + 1));
            lVar10 = lVar10 + 1;
          } while (lVar10 < ref_cell->node_per);
        }
        uVar4 = ref_dict_location(local_180,local_118[0],&local_184);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x1ab,"ref_clump_tri_around",(ulong)uVar4,"ret");
          return uVar4;
        }
        fprintf(__s," %d",(ulong)(local_184 + 1));
        fputc(10,__s);
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_178->n);
    }
    fclose(__s);
    uVar4 = ref_dict_free(local_178);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1b2
             ,"ref_clump_tri_around",(ulong)uVar4,"free tris");
      return uVar4;
    }
    uVar4 = ref_dict_free(local_180);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar7 = "free nodes";
    uVar6 = 0x1b3;
  }
  else {
    pcVar7 = "create nodes";
    uVar6 = 0x180;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_tri_around",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tri_around(REF_GRID ref_grid, REF_INT node,
                                        const char *filename) {
  REF_DICT node_dict, tri_dict;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT local;
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_DBL m[6], jacob[9];

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(tri_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(
      f,
      "zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      ref_dict_n(node_dict), ref_dict_n(tri_dict), "point", "fequadrilateral");

  RSS(ref_node_metric_get(ref_grid_node(ref_grid), node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");
  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 0, node);
    xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 1, node);
    xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e\n", xyz_comp[0], xyz_comp[1], xyz_comp[2]);
  }

  for (item = 0; item < ref_dict_n(tri_dict); item++) {
    cell = ref_dict_key(tri_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    RSS(ref_dict_location(node_dict, nodes[0], &local), "ret");
    fprintf(f, " %d", local + 1);
    fprintf(f, "\n");
  }

  fclose(f);

  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}